

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-from-pseudo-trace-type.cpp
# Opt level: O1

unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
__thiscall
yactfr::internal::TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst
          (TraceTypeFromPseudoTraceTypeConverter *this,PseudoDst *pseudoDst)

{
  ulong uVar1;
  long *plVar2;
  PseudoDt *pPVar3;
  _Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> __fn;
  _Tuple_impl<0UL,_const_yactfr::DataStreamType_*,_std::default_delete<const_yactfr::DataStreamType>_>
  __args;
  long lVar4;
  int __flags;
  __hash_code __code;
  PseudoDst *pPVar5;
  PseudoTraceType *pPVar6;
  PseudoDst *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__child_stack;
  long *plVar7;
  pointer *__ptr;
  __node_base _Var8;
  PseudoDst *__arg;
  long *plVar9;
  ClockType *local_d8;
  _Head_base<0UL,_const_yactfr::StructureType_*,_false> local_d0;
  __uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
  local_c8;
  undefined1 local_c0 [8];
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_b8;
  _Tuple_impl<0UL,_const_yactfr::DataStreamType_*,_std::default_delete<const_yactfr::DataStreamType>_>
  local_b0;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_a8;
  _Base_ptr local_a0;
  EventRecordTypeSet ertSet;
  PseudoErtSet pseudoErts;
  
  pseudoErts._M_h._M_buckets = &pseudoErts._M_h._M_single_bucket;
  pseudoErts._M_h._M_bucket_count = 1;
  pseudoErts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pseudoErts._M_h._M_element_count = 0;
  pseudoErts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pseudoErts._M_h._M_rehash_policy._M_next_resize = 0;
  pseudoErts._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar1 = in_RDX->_id;
  __arg = *(PseudoDst **)(pseudoDst->_id + 0x130);
  plVar7 = *(long **)(*(long *)(pseudoDst->_id + 0x128) + (uVar1 % (ulong)__arg) * 8);
  plVar9 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar2 = (long *)*plVar7, plVar9 = plVar7, uVar1 != ((long *)*plVar7)[1])) {
    while (plVar7 = plVar2, plVar2 = (long *)*plVar7, plVar2 != (long *)0x0) {
      plVar9 = (long *)0x0;
      if (((ulong)plVar2[1] % (ulong)__arg != uVar1 % (ulong)__arg) ||
         (plVar9 = plVar7, uVar1 == plVar2[1])) goto LAB_0023fe21;
    }
    plVar9 = (long *)0x0;
  }
LAB_0023fe21:
  if (plVar9 == (long *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *plVar9;
  }
  local_b0.super__Head_base<0UL,_const_yactfr::DataStreamType_*,_false>._M_head_impl =
       (_Head_base<0UL,_const_yactfr::DataStreamType_*,_false>)
       (_Head_base<0UL,_const_yactfr::DataStreamType_*,_false>)this;
  if ((lVar4 != 0) && (plVar7 = *(long **)(lVar4 + 0x20), plVar7 != (long *)0x0)) {
    do {
      local_c0 = (undefined1  [8])(plVar7 + 2);
      ertSet._M_t._M_impl._0_8_ =
           (_Hashtable<yactfr::internal::PseudoErt*,yactfr::internal::PseudoErt*,std::allocator<yactfr::internal::PseudoErt*>,std::__detail::_Identity,std::equal_to<yactfr::internal::PseudoErt*>,std::hash<yactfr::internal::PseudoErt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)&pseudoErts;
      std::
      _Hashtable<yactfr::internal::PseudoErt*,yactfr::internal::PseudoErt*,std::allocator<yactfr::internal::PseudoErt*>,std::__detail::_Identity,std::equal_to<yactfr::internal::PseudoErt*>,std::hash<yactfr::internal::PseudoErt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<yactfr::internal::PseudoErt*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<yactfr::internal::PseudoErt*,false>>>>
                ((_Hashtable<yactfr::internal::PseudoErt*,yactfr::internal::PseudoErt*,std::allocator<yactfr::internal::PseudoErt*>,std::__detail::_Identity,std::equal_to<yactfr::internal::PseudoErt*>,std::hash<yactfr::internal::PseudoErt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&pseudoErts,local_c0,&ertSet);
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  PseudoDst::validate(in_RDX,&pseudoErts);
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ertSet._M_t._M_impl.super__Rb_tree_header._M_header;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  __flags = 0;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __child_stack = extraout_RDX;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pseudoErts._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var8 = pseudoErts._M_h._M_before_begin;
    do {
      pPVar5 = in_RDX;
      _ertFromPseudoErt((TraceTypeFromPseudoTraceTypeConverter *)local_c0,(PseudoErt *)pseudoDst,
                        (PseudoDst *)_Var8._M_nxt[1]._M_nxt);
      __flags = (int)pPVar5;
      std::
      _Rb_tree<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::_Identity<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>
      ::
      _M_insert_unique<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>
                ((_Rb_tree<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::_Identity<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>
                  *)&ertSet,
                 (unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                  *)local_c0);
      std::
      unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
      ::~unique_ptr((unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                     *)local_c0);
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
      __child_stack = extraout_RDX_00;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  local_a0 = (_Base_ptr)in_RDX->_id;
  pPVar3 = (in_RDX->_pseudoPktCtxType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if (pPVar3 == (PseudoDt *)0x0) {
    local_c8._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
    .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
         (tuple<const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>)
         (_Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
          )0x0;
  }
  else {
    pPVar6 = (PseudoTraceType *)pseudoDst->_id;
    __arg = in_RDX;
    dtFromPseudoRootDt((internal *)&local_c8,pPVar3,PacketContext,pPVar6,in_RDX,(PseudoErt *)0x0);
    __flags = (int)pPVar6;
    __child_stack = extraout_RDX_01;
  }
  __args.super__Head_base<0UL,_const_yactfr::DataStreamType_*,_false>._M_head_impl =
       local_b0.super__Head_base<0UL,_const_yactfr::DataStreamType_*,_false>._M_head_impl;
  pPVar3 = (in_RDX->_pseudoErHeaderType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if (pPVar3 == (PseudoDt *)0x0) {
    local_d0._M_head_impl = (StructureType *)0x0;
  }
  else {
    pPVar6 = (PseudoTraceType *)pseudoDst->_id;
    __arg = in_RDX;
    dtFromPseudoRootDt((internal *)&local_d0,pPVar3,EventRecordHeader,pPVar6,in_RDX,(PseudoErt *)0x0
                      );
    __flags = (int)pPVar6;
    __child_stack = extraout_RDX_02;
  }
  pPVar3 = (in_RDX->_pseudoErCommonCtxType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if (pPVar3 == (PseudoDt *)0x0) {
    local_d8 = (ClockType *)0x0;
  }
  else {
    pPVar6 = (PseudoTraceType *)pseudoDst->_id;
    __arg = in_RDX;
    dtFromPseudoRootDt((internal *)&local_d8,pPVar3,EventRecordCommonContext,pPVar6,in_RDX,
                       (PseudoErt *)0x0);
    __flags = (int)pPVar6;
    __child_stack = extraout_RDX_03;
  }
  local_a8._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       in_RDX->_defClkType;
  __fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (in_RDX->super_WithAttrsMixin)._attrs._M_t.
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>;
  if (__fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl == (MapItem *)0x0) {
    local_b8._M_t.
    super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
    super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
    super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>,_true,_true>
          )(__uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  }
  else {
    MapItem::clone((MapItem *)local_c0,
                   (__fn *)__fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl,
                   __child_stack,__flags,__arg);
    local_b8._M_t.
    super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
    super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
    super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>,_true,_true>
            )local_c0;
    local_c0 = (undefined1  [8])0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_c0);
  }
  std::
  make_unique<yactfr::DataStreamType_const,unsigned_long_long,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,std::set<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,yactfr::ClockType_const*,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((unsigned_long_long *)
             __args.super__Head_base<0UL,_const_yactfr::DataStreamType_*,_false>._M_head_impl,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a0,&in_RDX->_ns,&in_RDX->_name,
             (set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
              *)&in_RDX->_uid,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&ertSet,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&local_c8,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&local_d0,&local_d8,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_a8);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_b8);
  if (local_d8 != (ClockType *)0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)&local_d8,(StructureType *)local_d8);
  }
  if (local_d0._M_head_impl != (StructureType *)0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)&local_d0,local_d0._M_head_impl);
  }
  if (local_c8._M_t.
      super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
      .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
       )0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)&local_c8,
               (StructureType *)
               local_c8._M_t.
               super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
               .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl);
  }
  std::
  _Rb_tree<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_std::_Identity<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
  ::~_Rb_tree(&ertSet._M_t);
  std::
  _Hashtable<yactfr::internal::PseudoErt_*,_yactfr::internal::PseudoErt_*,_std::allocator<yactfr::internal::PseudoErt_*>,_std::__detail::_Identity,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::hash<yactfr::internal::PseudoErt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&pseudoErts._M_h);
  return (unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
          )__args.super__Head_base<0UL,_const_yactfr::DataStreamType_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<const DataStreamType> TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst(PseudoDst& pseudoDst)
{
    // collect pseudo child event record types
    PseudoErtSet pseudoErts;
    const auto it = _pseudoTraceType->pseudoOrphanErts().find(pseudoDst.id());

    if (it != _pseudoTraceType->pseudoOrphanErts().end()) {
        for (auto& ertIdPseudoOrphanErtPair : it->second) {
            pseudoErts.insert(&ertIdPseudoOrphanErtPair.second.pseudoErt());
        }
    }

    // validate pseudo data stream type before converting
    pseudoDst.validate(pseudoErts);

    // convert pseudo event record types
    EventRecordTypeSet ertSet;

    for (auto pseudoErt : pseudoErts) {
        ertSet.insert(this->_ertFromPseudoErt(*pseudoErt, pseudoDst));
    }

    // create yactfr data stream type
    return DataStreamType::create(pseudoDst.id(), pseudoDst.ns(), pseudoDst.name(),
                                  pseudoDst.uid(), std::move(ertSet),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoPktCtxType(),
                                                                     Scope::PacketContext,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErHeaderType(),
                                                                     Scope::EventRecordHeader,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErCommonCtxType(),
                                                                     Scope::EventRecordCommonContext,
                                                                     &pseudoDst),
                                  pseudoDst.defClkType(), tryCloneAttrs(pseudoDst.attrs()));
}